

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O2

Future<std::error_code> * __thiscall
cinatra::coro_http_server::async_start
          (Future<std::error_code> *__return_storage_ptr__,coro_http_server *this)

{
  int iVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int in_EDX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar3;
  Promise<std::error_code> promise;
  undefined1 local_50 [16];
  undefined1 local_40;
  _Variadic_union<std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr> local_38;
  coro_http_server *local_28;
  
  iVar1 = listen(this,(int)this,in_EDX);
  (this->errc_)._M_value = iVar1;
  (this->errc_)._M_cat = (error_category *)CONCAT44(extraout_var,extraout_EDX);
  async_simple::Promise<std::error_code>::Promise((Promise<std::error_code> *)(local_50 + 8));
  async_simple::Promise<std::error_code>::getFuture
            (__return_storage_ptr__,(Promise<std::error_code> *)(local_50 + 8));
  if ((this->errc_)._M_value == 0) {
    uVar2 = extraout_EDX_00;
    uVar3 = extraout_var_00;
    if (this->out_ctx_ == (io_context *)0x0) {
      local_50._0_8_ = this;
      std::thread::thread<cinatra::coro_http_server::async_start()::_lambda()_1_,,void>
                ((thread *)&local_38,(anon_class_8_1_8991fb9c_for__M_head_impl *)local_50);
      std::thread::operator=(&this->thd_,(thread *)&local_38);
      std::thread::~thread((thread *)&local_38);
      uVar2 = extraout_EDX_01;
      uVar3 = extraout_var_01;
    }
    accept((coro_http_server *)local_50,(int)this,(sockaddr *)CONCAT44(uVar3,uVar2),
           (socklen_t *)CONCAT71(in_register_00000009,in_CL));
    local_38._M_rest._0_8_ = (undefined8)local_50._8_8_;
    local_50._8_8_ = (_Variadic_union<std::__exception_ptr::exception_ptr>)0x0;
    local_38._8_1_ = local_40;
    local_40 = 0;
    local_28 = this;
    async_simple::coro::detail::LazyBase<std::error_code,_false>::
    start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_example____include_cinatra_coro_http_server_hpp:96:22)>
              ((LazyBase<std::error_code,_false> *)local_50,(type *)&local_38);
    async_simple::Promise<std::error_code>::~Promise((Promise<std::error_code> *)&local_38);
    async_simple::coro::detail::LazyBase<std::error_code,_false>::~LazyBase
              ((LazyBase<std::error_code,_false> *)local_50);
  }
  else {
    local_38._M_rest._0_8_ = (undefined8)*(undefined8 *)&this->errc_;
    local_38._8_8_ = (this->errc_)._M_cat;
    local_28 = (coro_http_server *)CONCAT71(local_28._1_7_,1);
    async_simple::Promise<std::error_code>::setValue
              ((Promise<std::error_code> *)(local_50 + 8),(Try<std::error_code> *)&local_38);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>::
    ~_Variant_storage((_Variant_storage<false,_std::monostate,_std::error_code,_std::__exception_ptr::exception_ptr>
                       *)&local_38);
  }
  async_simple::Promise<std::error_code>::~Promise((Promise<std::error_code> *)(local_50 + 8));
  return __return_storage_ptr__;
}

Assistant:

async_simple::Future<std::error_code> async_start() {
    errc_ = listen();

    async_simple::Promise<std::error_code> promise;
    auto future = promise.getFuture();

    if (!errc_) {
      if (out_ctx_ == nullptr) {
        thd_ = std::thread([this] {
          pool_->run();
        });
      }

      accept().start([p = std::move(promise), this](auto &&res) mutable {
        if (res.hasError()) {
          errc_ = std::make_error_code(std::errc::io_error);
          p.setValue(errc_);
        }
        else {
          p.setValue(res.value());
        }
      });
    }
    else {
      promise.setValue(errc_);
    }

    return future;
  }